

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite_orm.h
# Opt level: O0

void __thiscall
sqlite_orm::internal::object_from_column_builder<relive::Stream>::operator()
          (object_from_column_builder<relive::Stream> *this,
          column_t<relive::Stream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&(relive::Stream::*)()_const,_void_(relive::Stream::*)(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *c)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  string value;
  code *local_88;
  string local_58 [4];
  int in_stack_ffffffffffffffac;
  sqlite3_stmt *in_stack_ffffffffffffffb0;
  row_extractor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  *in_stack_ffffffffffffffb8;
  string local_30 [32];
  long local_10;
  
  *(int *)(in_RDI + 8) = *(int *)(in_RDI + 8) + 1;
  local_10 = in_RSI;
  row_extractor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::extract(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  if (*(long *)(local_10 + 0x20) == -1) {
    local_88 = *(code **)(local_10 + 0x38);
    plVar1 = (long *)(*(long *)(in_RDI + 0x10) + *(long *)(local_10 + 0x40));
    if (((ulong)local_88 & 1) != 0) {
      local_88 = *(code **)(local_88 + *plVar1 + -1);
    }
    std::__cxx11::string::string(local_58,local_30);
    (*local_88)(plVar1,local_58);
    std::__cxx11::string::~string(local_58);
  }
  else {
    std::__cxx11::string::operator=
              ((string *)(*(long *)(in_RDI + 0x10) + *(long *)(local_10 + 0x20)),local_30);
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void operator()(const C &c) const {
        using field_type = typename C::field_type;
        auto value = row_extractor<field_type>().extract(this->stmt, this->index++);
        if(c.member_pointer) {
            this->object.*c.member_pointer = std::move(value);
        } else {
            ((this->object).*(c.setter))(std::move(value));
        }
    }